

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::NegativeTestBase::testDrawArray(NegativeTestBase *this,bool use_version_400)

{
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  undefined1 local_f8 [8];
  shaderSource vertex_data;
  shaderSource tess_eval_data;
  shaderSource tess_ctrl_data;
  shaderSource geometry_data;
  undefined1 local_68 [8];
  shaderSource fragment_data;
  program program;
  bool use_version_400_local;
  NegativeTestBase *this_local;
  
  Utils::program::program
            ((program *)&fragment_data.m_use_lengths,(this->super_TestBase).super_TestCase.m_context
            );
  Utils::shaderSource::shaderSource((shaderSource *)local_68);
  Utils::shaderSource::shaderSource((shaderSource *)&tess_ctrl_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)&tess_eval_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)&vertex_data.m_use_lengths);
  Utils::shaderSource::shaderSource((shaderSource *)local_f8);
  TestBase::initShaderSource
            (&this->super_TestBase,FRAGMENT_SHADER,use_version_400,(shaderSource *)local_68);
  TestBase::initShaderSource
            (&this->super_TestBase,GEOMETRY_SHADER,use_version_400,
             (shaderSource *)&tess_ctrl_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,TESS_CTRL_SHADER,use_version_400,
             (shaderSource *)&tess_eval_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,TESS_EVAL_SHADER,use_version_400,
             (shaderSource *)&vertex_data.m_use_lengths);
  TestBase::initShaderSource
            (&this->super_TestBase,VERTEX_SHADER,use_version_400,(shaderSource *)local_f8);
  Utils::shaderSource::shaderSource((shaderSource *)&exc_1,(GLchar *)0x0);
  Utils::program::build
            ((program *)&fragment_data.m_use_lengths,(shaderSource *)&exc_1,(shaderSource *)local_68
             ,(shaderSource *)&tess_ctrl_data.m_use_lengths,
             (shaderSource *)&tess_eval_data.m_use_lengths,
             (shaderSource *)&vertex_data.m_use_lengths,(shaderSource *)local_f8,(GLchar **)0x0,0,
             false);
  Utils::shaderSource::~shaderSource((shaderSource *)&exc_1);
  Utils::shaderSource::~shaderSource((shaderSource *)local_f8);
  Utils::shaderSource::~shaderSource((shaderSource *)&vertex_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)&tess_eval_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)&tess_ctrl_data.m_use_lengths);
  Utils::shaderSource::~shaderSource((shaderSource *)local_68);
  Utils::program::~program((program *)&fragment_data.m_use_lengths);
  return false;
}

Assistant:

bool NegativeTestBase::testDrawArray(bool use_version_400)
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource fragment_data;
	Utils::shaderSource geometry_data;
	Utils::shaderSource tess_ctrl_data;
	Utils::shaderSource tess_eval_data;
	Utils::shaderSource vertex_data;

	initShaderSource(Utils::FRAGMENT_SHADER, use_version_400, fragment_data);
	initShaderSource(Utils::GEOMETRY_SHADER, use_version_400, geometry_data);
	initShaderSource(Utils::TESS_CTRL_SHADER, use_version_400, tess_ctrl_data);
	initShaderSource(Utils::TESS_EVAL_SHADER, use_version_400, tess_eval_data);
	initShaderSource(Utils::VERTEX_SHADER, use_version_400, vertex_data);

	/* Build program */
	try
	{
		program.build(0 /* compute shader */, fragment_data, geometry_data, tess_ctrl_data, tess_eval_data, vertex_data,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Compilation failed, as expected. Verify that reason of failure is as expected */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Shader compilation error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}

	/* Build process succeded */
	return false;
}